

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string * __thiscall
kratos::Stream::get_var_decl_abi_cxx11_(string *__return_storage_ptr__,Stream *this,Var *var)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  InternalException *this_00;
  long lVar5;
  bool *pbVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  reference pvVar8;
  size_type sVar9;
  ulong uVar10;
  Var *extraout_RDX;
  Var *extraout_RDX_00;
  Var *var_00;
  Var *var_01;
  Var *var_02;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  undefined8 *local_1b8;
  allocator<char> local_189;
  string local_188 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  undefined1 local_151;
  undefined1 local_150 [8];
  string array_str_1;
  string array_str;
  string var_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  iterator local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  string local_90;
  undefined8 *local_70;
  EnumType *v_1;
  undefined1 local_58 [8];
  shared_ptr<kratos::VarPackedStruct> v;
  string local_38 [8];
  string type;
  Var *var_local;
  string *var_str;
  
  type.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  bVar1 = (**(code **)(*(long *)type.field_2._8_8_ + 0xb8))();
  if ((bVar1 & 1) == 0) {
    bVar1 = (**(code **)(*(long *)type.field_2._8_8_ + 0xd0))();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::operator=(local_38,"logic");
    }
    else {
      if (type.field_2._8_8_ == 0) {
        local_1b8 = (undefined8 *)0x0;
      }
      else {
        local_1b8 = (undefined8 *)
                    __dynamic_cast(type.field_2._8_8_,&Var::typeinfo,&EnumType::typeinfo,
                                   0xfffffffffffffffe);
      }
      local_70 = local_1b8;
      if (local_1b8 == (undefined8 *)0x0) {
        str.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Unable to resolve var to enum type",
                   (allocator<char> *)
                   ((long)&str.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        InternalException::InternalException(this_00,&local_90);
        str.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
      }
      lVar5 = (**(code **)*local_1b8)();
      std::__cxx11::string::operator=(local_38,(string *)(lVar5 + 0x40));
    }
  }
  else {
    Var::as<kratos::VarPackedStruct>((Var *)local_58);
    peVar3 = std::
             __shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x2d])(&v_1);
    peVar4 = std::
             __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v_1);
    std::__cxx11::string::operator=(local_38,(string *)peVar4);
    std::shared_ptr<kratos::PackedStruct>::~shared_ptr((shared_ptr<kratos::PackedStruct> *)&v_1);
    std::shared_ptr<kratos::VarPackedStruct>::~shared_ptr
              ((shared_ptr<kratos::VarPackedStruct> *)local_58);
  }
  std::__cxx11::string::string((string *)&local_e0,local_38);
  local_c0 = &local_e0;
  local_b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(var_width.field_2._M_local_buf + 0xf));
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b0,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(var_width.field_2._M_local_buf + 0xf));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(var_width.field_2._M_local_buf + 0xf));
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  do {
    local_1e0 = local_1e0 + -1;
    std::__cxx11::string::~string((string *)local_1e0);
  } while (local_1e0 != &local_e0);
  pbVar6 = Var::is_signed((Var *)type.field_2._8_8_);
  var_00 = extraout_RDX;
  if ((*pbVar6 & 1U) != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (char (*) [7])0x428fa0);
    var_00 = extraout_RDX_00;
  }
  SystemVerilogCodeGen::get_var_width_str_abi_cxx11_
            ((string *)((long)&array_str.field_2 + 8),(SystemVerilogCodeGen *)type.field_2._8_8_,
             var_00);
  pvVar7 = Var::size((Var *)type.field_2._8_8_);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
  if (*pvVar8 < 2) {
    pvVar7 = Var::size((Var *)type.field_2._8_8_);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if ((sVar9 < 2) && (bVar2 = Var::explicit_array((Var *)type.field_2._8_8_), !bVar2)) {
      uVar10 = std::__cxx11::string::empty();
      if (((uVar10 & 1) == 0) &&
         (bVar1 = (**(code **)(*(long *)type.field_2._8_8_ + 0xd0))(), (bVar1 & 1) == 0)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&array_str.field_2 + 8));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (type.field_2._8_8_ + 0x78));
      goto LAB_0038a40a;
    }
  }
  bVar1 = (**(code **)(*(long *)type.field_2._8_8_ + 0xc0))();
  if ((bVar1 & 1) == 0) {
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&array_str.field_2 + 8));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (type.field_2._8_8_ + 0x78));
    get_var_size_str_abi_cxx11_((string *)local_150,(kratos *)type.field_2._8_8_,var_02);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    std::__cxx11::string::~string((string *)local_150);
  }
  else {
    get_var_size_str_abi_cxx11_
              ((string *)((long)&array_str_1.field_2 + 8),(kratos *)type.field_2._8_8_,var_01);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::string::append((string *)(array_str_1.field_2._M_local_buf + 8));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&array_str_1.field_2 + 8));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (type.field_2._8_8_ + 0x78));
    std::__cxx11::string::~string((string *)(array_str_1.field_2._M_local_buf + 8));
  }
LAB_0038a40a:
  local_151 = 0;
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b0);
  local_168._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188," ",&local_189);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__return_storage_ptr__,(string *)local_160,local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,in_R8);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  local_151 = 1;
  std::__cxx11::string::~string((string *)(array_str.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Stream::get_var_decl(kratos::Var* var) {
    // based on whether it's packed or not
    std::string type;
    if (var->is_struct()) {
        auto v = var->as<VarPackedStruct>();
        type = v->packed_struct()->struct_name;
    } else if (var->is_enum()) {
        auto* v = dynamic_cast<EnumType*>(var);
        if (!v) throw InternalException("Unable to resolve var to enum type");
        type = v->enum_type()->name;
    } else {
        type = "logic";
    }

    std::vector<std::string> str = {type};
    if (var->is_signed()) str.emplace_back("signed");
    std::string var_width = SystemVerilogCodeGen::get_var_width_str(var);
    if (var->size().front() > 1 || var->size().size() > 1 || var->explicit_array()) {
        // it's an array
        if (var->is_packed()) {
            std::string array_str = get_var_size_str(var);
            if (!var_width.empty()) array_str.append(var_width);
            str.emplace_back(array_str);
            str.emplace_back(var->name);
        } else {
            if (!var_width.empty()) str.emplace_back(var_width);
            str.emplace_back(var->name);
            std::string array_str = get_var_size_str(var);
            str.emplace_back(array_str);
        }
    } else {
        // scalar
        if (!var_width.empty() && !var->is_enum()) str.emplace_back(var_width);
        str.emplace_back(var->name);
    }

    auto var_str = string::join(str.begin(), str.end(), " ");
    return var_str;
}